

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O0

void STATE_board_print_debug(chess_state_t *s)

{
  char cVar1;
  char local_1d;
  int local_1c;
  int iStack_18;
  char c;
  int color;
  int file;
  int rank;
  chess_state_t *s_local;
  
  for (color = 7; -1 < color; color = color + -1) {
    fprintf(_stdout,"#%c ",(ulong)(color + 0x31));
    for (iStack_18 = 0; iStack_18 < 8; iStack_18 = iStack_18 + 1) {
      local_1d = '-';
      for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
        cVar1 = (char)iStack_18;
        if ((s->bitboard[local_1c * 7 + 6] & 1L << ((char)(color << 3) + cVar1 & 0x3fU)) != 0) {
          if ((s->bitboard[local_1c * 7] & 1L << ((char)(color << 3) + cVar1 & 0x3fU)) != 0) {
            local_1d = 'P';
          }
          if ((s->bitboard[local_1c * 7 + 1] & 1L << ((char)(color << 3) + cVar1 & 0x3fU)) != 0) {
            local_1d = 'N';
          }
          if ((s->bitboard[local_1c * 7 + 2] & 1L << ((char)(color << 3) + cVar1 & 0x3fU)) != 0) {
            local_1d = 'B';
          }
          if ((s->bitboard[local_1c * 7 + 3] & 1L << ((char)(color << 3) + cVar1 & 0x3fU)) != 0) {
            local_1d = 'R';
          }
          if ((s->bitboard[local_1c * 7 + 4] & 1L << ((char)(color << 3) + cVar1 & 0x3fU)) != 0) {
            local_1d = 'Q';
          }
          if ((s->bitboard[local_1c * 7 + 5] & 1L << ((char)(color << 3) + cVar1 & 0x3fU)) != 0) {
            local_1d = 'K';
          }
          if (local_1c == 1) {
            local_1d = local_1d + ' ';
          }
        }
      }
      fprintf(_stdout,"%c ",(ulong)(uint)(int)local_1d);
    }
    fprintf(_stdout,"\n");
  }
  fprintf(_stdout,"   A B C D E F G H\n");
  return;
}

Assistant:

void STATE_board_print_debug(const chess_state_t *s)
{
    int rank, file, color;
    for(rank = 7; rank >= 0; rank--) {
        fprintf(stdout, "#%c ", rank + '1');
        for(file = 0; file < 8; file++) {
            char c = '-';
            for(color = WHITE; color <= BLACK; color++) {
                if(s->bitboard[color*NUM_TYPES+ALL] & BITBOARD_RANK_FILE(rank, file)) {
                    if(s->bitboard[color*NUM_TYPES+PAWN] & BITBOARD_RANK_FILE(rank, file)) c = 'P';
                    if(s->bitboard[color*NUM_TYPES+KNIGHT] & BITBOARD_RANK_FILE(rank, file)) c = 'N';
                    if(s->bitboard[color*NUM_TYPES+BISHOP] & BITBOARD_RANK_FILE(rank, file)) c = 'B';
                    if(s->bitboard[color*NUM_TYPES+ROOK] & BITBOARD_RANK_FILE(rank, file)) c = 'R';
                    if(s->bitboard[color*NUM_TYPES+QUEEN] & BITBOARD_RANK_FILE(rank, file)) c = 'Q';
                    if(s->bitboard[color*NUM_TYPES+KING] & BITBOARD_RANK_FILE(rank, file)) c = 'K';
                    if(color == BLACK) c += 32;
                }
            }
            fprintf(stdout, "%c ", c);
        }
        fprintf(stdout, "\n");
    }
    fprintf(stdout, "   A B C D E F G H\n");
}